

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

uint8_t __thiscall AmpIO::GetAmpEnableMask(AmpIO *this)

{
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  byte bVar4;
  byte bVar5;
  uint i;
  uint index;
  
  uVar3 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar3 == 0x514c4131) {
    bVar5 = (byte)this->ReadBuffer[1] & 0xf;
  }
  else {
    bVar5 = 0;
    for (index = 0; index < this->NumMotors; index = index + 1) {
      bVar2 = GetAmpEnable(this,index);
      bVar1 = (byte)index & 0x1f;
      bVar4 = (byte)(1 << bVar1);
      if (!bVar2) {
        bVar4 = (byte)(0 << bVar1);
      }
      bVar5 = bVar4 | bVar5;
    }
  }
  return bVar5;
}

Assistant:

uint8_t AmpIO::GetAmpEnableMask(void) const
{
    uint8_t ampEnable = 0;
    if (GetHardwareVersion() == QLA1_String) {
        // For the QLA, the following is more efficient than the general case
        ampEnable = GetStatus()&0x0000000f;
    }
    else {
        for (unsigned int i = 0; i < NumMotors; i++) {
            if (GetAmpEnable(i))
                ampEnable |= (1 << i);
        }
    }
    return ampEnable;
}